

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall
Rml::DataParser::Function(DataParser *this,Instruction instruction,int num_arguments,String *name)

{
  code *pcVar1;
  bool bVar2;
  value_type local_b8;
  uint local_84;
  value_type local_80;
  String local_40;
  String *local_20;
  String *name_local;
  int num_arguments_local;
  Instruction instruction_local;
  DataParser *this_local;
  
  local_20 = name;
  name_local._0_4_ = num_arguments;
  name_local._4_4_ = instruction;
  _num_arguments_local = this;
  if (((instruction != TransformFnc) && (instruction != EventFnc)) &&
     (bVar2 = Assert("RMLUI_ASSERT(instruction == Instruction::TransformFnc || instruction == Instruction::EventFnc)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0xf4), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (((int)(uint)name_local < 0) &&
     (bVar2 = Assert("RMLUI_ASSERT(num_arguments >= 0)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0xf5), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (this->program_stack_size < (int)(uint)name_local) {
    CreateString_abi_cxx11_
              (&local_40,
               "Internal parser error: Popping %d arguments, but the stack contains only %d elements."
               ,(ulong)(uint)name_local,(ulong)(uint)this->program_stack_size);
    Error(this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    this->program_stack_size = this->program_stack_size - (uint)name_local;
    local_80.instruction = NumArguments;
    local_84 = (uint)name_local;
    Variant::Variant<int,void>(&local_80.data,(int *)&local_84);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::push_back
              (&this->program,&local_80);
    InstructionData::~InstructionData(&local_80);
    local_b8.instruction = name_local._4_4_;
    Variant::Variant<std::__cxx11::string,void>(&local_b8.data,local_20);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::push_back
              (&this->program,&local_b8);
    InstructionData::~InstructionData(&local_b8);
  }
  return;
}

Assistant:

void Function(Instruction instruction, int num_arguments, String&& name)
	{
		RMLUI_ASSERT(instruction == Instruction::TransformFnc || instruction == Instruction::EventFnc);
		RMLUI_ASSERT(num_arguments >= 0);
		if (program_stack_size < num_arguments)
		{
			Error(CreateString("Internal parser error: Popping %d arguments, but the stack contains only %d elements.", num_arguments,
				program_stack_size));
			return;
		}
		program_stack_size -= num_arguments;
		program.push_back(InstructionData{Instruction::NumArguments, Variant(int(num_arguments))});
		program.push_back(InstructionData{instruction, Variant(std::move(name))});
	}